

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

void Hex::Hexdumper<unsigned_char>::output_bin(ostream *os,remove_const_t<unsigned_char> val)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  ostream oVar5;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  int iVar8;
  ulong uVar9;
  char bits [257];
  ostream aoStack_12a [2];
  byte abStack_128 [264];
  
  uVar9 = CONCAT71(in_register_00000031,val);
  uVar6 = 0;
  if ((int)uVar9 != 0) {
    uVar7 = uVar9 & 0xffffffff;
    do {
      bVar4 = (byte)uVar9;
      abStack_128[uVar6] = bVar4 & 1 | 0x30;
      uVar6 = uVar6 + 1;
      uVar7 = uVar7 >> 1 & 0x7f;
      uVar9 = uVar7;
    } while (1 < bVar4);
  }
  abStack_128[uVar6 & 0xffffffff] = 0;
  lVar3 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar3;
  iVar2 = *(int *)(os + lVar3 + 0x10);
  if (os[lVar3 + 0xe1] == (ostream)0x1) {
    oVar5 = poVar1[0xe0];
  }
  else {
    oVar5 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar5;
    poVar1[0xe1] = (ostream)0x1;
  }
  iVar8 = (int)uVar6;
  if (iVar8 < iVar2) {
    aoStack_12a[1] = (ostream)0x20;
    if (oVar5 != (ostream)0x0) {
      aoStack_12a[1] = oVar5;
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)(iVar2 - iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(aoStack_12a + 1),1);
  }
  else {
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  if (0 < iVar8) {
    uVar9 = (uVar6 & 0xffffffff) + 1;
    do {
      aoStack_12a[1] = aoStack_12a[uVar9];
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(aoStack_12a + 1),1);
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }